

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall Clasp::ShortImplicationsGraph::ImplicationList::clear(ImplicationList *this,bool b)

{
  __pointer_type pBVar1;
  Block *t;
  Block *x;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  __pointer_type in_stack_ffffffffffffffd0;
  undefined8 local_18;
  
  bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::clear
            ((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
             in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
  pBVar1 = std::atomic::operator_cast_to_Block_
                     ((atomic<Clasp::ShortImplicationsGraph::Block_*> *)0x1cfa48);
  while (local_18 = pBVar1, local_18 != (__pointer_type)0x0) {
    pBVar1 = std::atomic::operator_cast_to_Block_
                       ((atomic<Clasp::ShortImplicationsGraph::Block_*> *)0x1cfa69);
    in_stack_ffffffffffffffd0 = local_18;
    if (local_18 != (__pointer_type)0x0) {
      operator_delete(local_18);
      in_stack_ffffffffffffffd0 = local_18;
    }
  }
  std::atomic<Clasp::ShortImplicationsGraph::Block_*>::operator=
            (&in_stack_ffffffffffffffd0->next,
             (__pointer_type)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void ShortImplicationsGraph::ImplicationList::clear(bool b) {
	ImpListBase::clear(b);
	for (Block* x = learnt; x; ) {
		Block* t = x;
		x = x->next;
		delete t;
	}
	learnt = 0;
}